

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapedLatticeRod.cpp
# Opt level: O3

void __thiscall
OpenMD::shapedLatticeRod::shapedLatticeRod
          (shapedLatticeRod *this,RealType latticeConstant,string *latticeType,RealType radius,
          RealType length)

{
  pointer pcVar1;
  string local_68;
  Vector3d local_48;
  Vector3d local_30;
  
  pcVar1 = (latticeType->_M_dataplus)._M_p;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar1,pcVar1 + latticeType->_M_string_length);
  shapedLattice::shapedLattice(&this->super_shapedLattice,latticeConstant,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  (this->super_shapedLattice)._vptr_shapedLattice = (_func_int **)&PTR__shapedLattice_002fcd18;
  this->rodRadius_ = radius;
  this->rodLength_ = length;
  local_30.super_Vector<double,_3U>.data_[0] = radius * 3.0;
  local_30.super_Vector<double,_3U>.data_[2] = length + local_30.super_Vector<double,_3U>.data_[0];
  local_30.super_Vector<double,_3U>.data_[1] = local_30.super_Vector<double,_3U>.data_[0];
  shapedLattice::setGridDimension(&this->super_shapedLattice,&local_30);
  local_48.super_Vector<double,_3U>.data_[0] = 0.0;
  local_48.super_Vector<double,_3U>.data_[1] = 0.0;
  local_48.super_Vector<double,_3U>.data_[2] = 0.0;
  shapedLattice::setOrigin(&this->super_shapedLattice,&local_48);
  return;
}

Assistant:

shapedLatticeRod::shapedLatticeRod(RealType latticeConstant,
                                     std::string latticeType, RealType radius,
                                     RealType length) :
      shapedLattice(latticeConstant, latticeType) {
    rodRadius_ = radius;
    rodLength_ = length;
    Vector3d dimension;
    dimension[0] = 3.0 * radius;
    dimension[1] = 3.0 * radius;
    dimension[2] = length + 3.0 * radius;
    setGridDimension(dimension);
    Vector3d origin;
    origin[0] = 0;
    origin[1] = 0;
    origin[2] = 0;
    setOrigin(origin);
  }